

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

QSizeF __thiscall QItemDelegatePrivate::doTextLayout(QItemDelegatePrivate *this,int lineWidth)

{
  undefined4 uVar1;
  qreal extraout_RDX;
  long in_FS_OFFSET;
  double dVar2;
  QSizeF QVar3;
  double local_70;
  double local_68;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::beginLayout();
  local_68 = 0.0;
  local_70 = 0.0;
  do {
    local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_48.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    uVar1 = QTextLayout::createLine();
    local_48.xp = (qreal)CONCAT44(local_48.xp._4_4_,uVar1);
    dVar2 = local_68;
    local_48.yp = extraout_RDX;
    if (extraout_RDX != 0.0) {
      QTextLine::setLineWidth((double)lineWidth);
      QTextLine::setPosition(&local_48);
      dVar2 = (double)QTextLine::height();
      local_70 = local_70 + dVar2;
      dVar2 = (double)QTextLine::naturalTextWidth();
      if (dVar2 <= local_68) {
        dVar2 = local_68;
      }
    }
    local_68 = dVar2;
  } while (extraout_RDX != 0.0);
  QTextLayout::endLayout();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  QVar3.ht = local_70;
  QVar3.wd = local_68;
  return QVar3;
}

Assistant:

QSizeF QItemDelegatePrivate::doTextLayout(int lineWidth) const
{
    qreal height = 0;
    qreal widthUsed = 0;
    textLayout.beginLayout();
    while (true) {
        QTextLine line = textLayout.createLine();
        if (!line.isValid())
            break;
        line.setLineWidth(lineWidth);
        line.setPosition(QPointF(0, height));
        height += line.height();
        widthUsed = qMax(widthUsed, line.naturalTextWidth());
    }
    textLayout.endLayout();
    return QSizeF(widthUsed, height);
}